

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

_Bool upb_MapIterator_Next(upb_Map *map,size_t *iter)

{
  _Bool _Var1;
  upb_value val;
  upb_strtable_iter it;
  size_t local_38;
  upb_value local_30;
  upb_strtable_iter local_28;
  
  if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
    local_28.t = (upb_strtable *)&map->t;
    local_28.index = *iter;
    upb_strtable_next(&local_28);
    *iter = local_28.index;
    _Var1 = upb_strtable_done(&local_28);
  }
  else {
    local_38 = *iter;
    upb_inttable_next(&(map->t).inttable,(uintptr_t *)&local_28,&local_30,(intptr_t *)&local_38);
    *iter = local_38;
    _Var1 = upb_inttable_done(&(map->t).inttable,local_38);
  }
  return (_Bool)(_Var1 ^ 1);
}

Assistant:

bool upb_MapIterator_Next(const upb_Map* map, size_t* iter) {
  return _upb_map_next(map, iter);
}